

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O3

String * __thiscall Bstrlib::String::operator+=(String *this,int64 c)

{
  String local_20;
  
  Print((char *)&local_20,"%lld",c);
  operator+=(this,&local_20);
  if (local_20.super_tagbstring.data != (uchar *)0x0) {
    free(local_20.super_tagbstring.data);
  }
  return this;
}

Assistant:

const String& String::operator +=(const int64 c)
    {
#ifndef HasFloatParsing
        char buffer[22] = { c < 0 ? '-': '\0' };
        Strings::ulltoa((uint64)(c < 0 ? -c : c), &buffer[c < 0 ? 1 : 0], 10);
        return *this += buffer;
#else
        return *this += String::Print(PF_LLD, c);
#endif
    }